

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  _Base_ptr __args;
  PropertiesMap *pPVar1;
  const_iterator __position;
  cmCTest *pcVar2;
  pointer pbVar3;
  cmCTestMultiProcessHandler *this_00;
  bool bVar4;
  mapped_type *ppcVar5;
  ostream *poVar6;
  mapped_type_conflict1 *pmVar7;
  cmCTestRunTest *pcVar8;
  iterator iVar9;
  long *plVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  bool bVar14;
  string *f;
  pointer __k;
  size_t __n;
  cmWorkingDirectory workdir;
  int local_21c;
  cmCTestRunTest *local_218;
  string local_210;
  cmCTestMultiProcessHandler *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  cmWorkingDirectory local_1a8 [2];
  ios_base local_138 [264];
  
  local_21c = test;
  if (this->HaveAffinity != 0) {
    pPVar1 = &this->Properties;
    ppcVar5 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&pPVar1->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_21c);
    if ((*ppcVar5)->WantAffinity == true) {
      local_1a8[0].OldDir._M_dataplus._M_p._0_4_ = local_21c;
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8);
      __n = (long)(*ppcVar5)->Processors;
      if (this->ParallelLevel < (ulong)(long)(*ppcVar5)->Processors) {
        __n = this->ParallelLevel;
      }
      if (((this->HaveAffinity != 0) && (this->HaveAffinity < __n)) &&
         (ppcVar5 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&pPVar1->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)local_1a8), (*ppcVar5)->WantAffinity != false)) {
        __n = this->HaveAffinity;
      }
      local_218 = (cmCTestRunTest *)
                  (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (local_218 < __n) {
        return false;
      }
      local_1a8[0].OldDir._M_dataplus._M_p = (pointer)0x0;
      local_1a8[0].OldDir._M_string_length = 0;
      local_1a8[0].OldDir.field_2._M_allocated_capacity = (unsigned_long *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,__n);
      if (__n != 0) {
        uVar13 = __n;
        do {
          __position._M_node =
               (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          __args = __position._M_node + 1;
          if (local_1a8[0].OldDir._M_string_length ==
              local_1a8[0].OldDir.field_2._M_allocated_capacity) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_1a8,
                       (iterator)local_1a8[0].OldDir._M_string_length,(unsigned_long *)__args);
          }
          else {
            *(unsigned_long *)local_1a8[0].OldDir._M_string_length = *(unsigned_long *)__args;
            local_1a8[0].OldDir._M_string_length = local_1a8[0].OldDir._M_string_length + 8;
          }
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)&this->ProcessorsAvailable,__position);
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (&(*ppcVar5)->Affinity,local_1a8);
      if (local_1a8[0].OldDir._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1a8[0].OldDir._M_dataplus._M_p,
                        local_1a8[0].OldDir.field_2._M_allocated_capacity -
                        (long)local_1a8[0].OldDir._M_dataplus._M_p);
      }
      if (local_218 < __n) {
        return false;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"test ",5);
  poVar6 = (ostream *)std::ostream::operator<<(local_1a8,local_21c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x9c,local_210._M_dataplus._M_p,this->Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pmVar7 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_21c);
  *pmVar7 = true;
  EraseTest(this,local_21c);
  local_1a8[0].OldDir._M_dataplus._M_p._0_4_ = local_21c;
  pPVar1 = &this->Properties;
  ppcVar5 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)local_1a8);
  uVar13 = (long)(*ppcVar5)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar5)->Processors) {
    uVar13 = this->ParallelLevel;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < uVar13)) &&
     (ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)local_1a8), (*ppcVar5)->WantAffinity != false)) {
    uVar13 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount + uVar13;
  pcVar8 = (cmCTestRunTest *)operator_new(0x228);
  cmCTestRunTest::cmCTestRunTest(pcVar8,this);
  pcVar2 = this->CTest;
  if (pcVar2->RepeatUntilFail == true) {
    pcVar8->RunUntilFail = true;
    pcVar8->NumberOfRunsLeft = pcVar2->RepeatTests;
  }
  pcVar8->Index = local_21c;
  ppcVar5 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_21c);
  pcVar8->TestProperties = *ppcVar5;
  __k = (this->Failed->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_218 = pcVar8;
  local_1f0 = this;
  if (__k != pbVar3) {
    do {
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&((*ppcVar5)->RequireSuccessDepends)._M_t,__k);
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&pPVar1->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_21c);
      if ((_Rb_tree_header *)iVar9._M_node !=
          &((*ppcVar5)->RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pcVar8->FailedDependencies,__k);
      }
      __k = __k + 1;
    } while (__k != pbVar3);
  }
  this_00 = local_1f0;
  LockResources(local_1f0,local_21c);
  ppcVar5 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&pPVar1->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_21c);
  cmWorkingDirectory::cmWorkingDirectory(local_1a8,&(*ppcVar5)->Directory);
  pcVar8 = local_218;
  if (local_1a8[0].ResultCode == 0) {
    bVar4 = cmCTestRunTest::StartTest(local_218,this_00->Completed,this_00->Total);
    bVar14 = true;
    if (bVar4) goto LAB_001dbe81;
  }
  else {
    ppcVar5 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&pPVar1->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_21c);
    pcVar8 = local_218;
    std::operator+(&local_1c8,"Failed to change working directory to ",&(*ppcVar5)->Directory);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_1d8 = *plVar11;
      lStack_1d0 = plVar10[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar11;
      local_1e8 = (long *)*plVar10;
    }
    local_1e0 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    strerror(local_1a8[0].ResultCode);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210.field_2._8_8_ = plVar10[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar12;
      local_210._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_210._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    cmCTestRunTest::StartFailure(pcVar8,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar14 = false;
  FinishTestProcess(this_00,pcVar8,false);
LAB_001dbe81:
  cmWorkingDirectory::~cmWorkingDirectory(local_1a8);
  return bVar14;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(*this);
  if (this->CTest->GetRepeatUntilFail()) {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (this->Properties[test]->RequireSuccessDepends.find(f) !=
        this->Properties[test]->RequireSuccessDepends.end()) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    testRun->StartFailure("Failed to change working directory to " +
                          this->Properties[test]->Directory + " : " +
                          std::strerror(workdir.GetLastResult()));
  } else {
    if (testRun->StartTest(this->Completed, this->Total)) {
      return true;
    }
  }

  this->FinishTestProcess(testRun, false);
  return false;
}